

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O0

int __thiscall
SudokuChain::getFieldIndex
          (SudokuChain *this,int x,int y,shared_ptr<SudokuChain::SudokuSpecification> *specification
          )

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  element_type *peVar6;
  ostream *poVar7;
  int local_74;
  int local_70;
  int y_index;
  int index;
  shared_ptr<SudokuChain::SudokuSpecification> local_60;
  int *local_50;
  int *yb;
  int *xb;
  int *ya;
  int *xa;
  shared_ptr<SudokuChain::SudokuSpecification> *psStack_28;
  bool debug;
  shared_ptr<SudokuChain::SudokuSpecification> *specification_local;
  int y_local;
  int x_local;
  SudokuChain *this_local;
  
  xa._7_1_ = 0;
  psStack_28 = specification;
  specification_local._0_4_ = y;
  specification_local._4_4_ = x;
  _y_local = this;
  peVar6 = std::
           __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)specification);
  bVar4 = std::operator==(&peVar6->previous,(nullptr_t)0x0);
  if (bVar4) {
    if ((xa._7_1_ & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"    (no previous)");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    iVar1 = (int)specification_local;
    iVar5 = peVar6->firstOwnIndex;
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    this_local._4_4_ = iVar5 + iVar1 * peVar6->squared_size + specification_local._4_4_;
  }
  else {
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    ya = &peVar6->xa;
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    xb = &peVar6->ya;
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    yb = &peVar6->xb;
    peVar6 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)specification);
    local_50 = &peVar6->yb;
    if ((((specification_local._4_4_ < *ya) || (*yb <= specification_local._4_4_)) ||
        ((int)specification_local < *xb)) || (*local_50 <= (int)specification_local)) {
      peVar6 = std::
               __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)specification);
      local_70 = peVar6->firstOwnIndex;
      for (local_74 = 0; local_74 < (int)specification_local; local_74 = local_74 + 1) {
        if ((local_74 < *xb) || (*local_50 <= local_74)) {
          peVar6 = std::
                   __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)specification);
          iVar5 = peVar6->squared_size;
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)specification);
          iVar5 = peVar6->squared_size - (*yb - *ya);
        }
        local_70 = iVar5 + local_70;
      }
      if (((*xb <= (int)specification_local) && ((int)specification_local < *local_50)) &&
         (*yb <= specification_local._4_4_)) {
        specification_local._4_4_ = specification_local._4_4_ - *yb;
      }
      local_70 = specification_local._4_4_ + local_70;
      this_local._4_4_ = local_70;
    }
    else {
      if ((xa._7_1_ & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"    (ask previous at (x,y)=(");
        iVar5 = specification_local._4_4_;
        peVar6 = std::
                 __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)specification);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5 + peVar6->offset_from_previous_x);
        poVar7 = std::operator<<(poVar7,", ");
        iVar5 = (int)specification_local;
        peVar6 = std::
                 __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)specification);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5 + peVar6->offset_from_previous_y);
        poVar7 = std::operator<<(poVar7,")");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      iVar3 = specification_local._4_4_;
      peVar6 = std::
               __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)specification);
      iVar2 = (int)specification_local;
      iVar5 = peVar6->offset_from_previous_x;
      peVar6 = std::
               __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)specification);
      iVar1 = peVar6->offset_from_previous_y;
      peVar6 = std::
               __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)specification);
      std::shared_ptr<SudokuChain::SudokuSpecification>::shared_ptr(&local_60,&peVar6->previous);
      this_local._4_4_ = getFieldIndex(this,iVar3 + iVar5,iVar2 + iVar1,&local_60);
      std::shared_ptr<SudokuChain::SudokuSpecification>::~shared_ptr(&local_60);
    }
  }
  return this_local._4_4_;
}

Assistant:

int SudokuChain::getFieldIndex(int x, int y, std::shared_ptr<SudokuSpecification> specification)
{
  bool debug = false;

  if(specification->previous == nullptr)
  {
    if(debug)
      std::cout<<"    (no previous)"<<std::endl;
    return specification->firstOwnIndex + y*specification->squared_size + x;
  }

  // compute coordinates of with previous overlapping area in current sudoku
  int &xa = specification->xa;
  int &ya = specification->ya;
  int &xb = specification->xb;
  int &yb = specification->yb;

  // check if position is inside with previous overlapping area in current sudoku
  if(x >= xa && x < xb && y >= ya && y < yb)
  {
    if(debug)
      std::cout<<"    (ask previous at (x,y)=("<<x+specification->offset_from_previous_x<<", "<<y+specification->offset_from_previous_y<<")"<<std::endl;
    return getFieldIndex(x+specification->offset_from_previous_x, y+specification->offset_from_previous_y, specification->previous);
  }
  else
  {
    int index = specification->firstOwnIndex;

    // number of elements in rows before current row (y)
    for(int y_index = 0; y_index < y; y_index++)
    {
      if(ya <= y_index && y_index < yb)
      {
        index += specification->squared_size - (xb-xa);
      }
      else
      {
        index += specification->squared_size;
      }
    }
    if(ya <= y && y < yb)
    {
      if(xb <= x)
      {
        index += x-xb;
      }
      else
      {
        index += x;
      }
    }
    else
    {
      index += x;
    }
    return index;
  }
}